

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall
helics::CommonCore::logMessage
          (CommonCore *this,LocalFederateId federateID,int logLevel,string_view messageToLog)

{
  FederateState *pFVar1;
  InvalidIdentifier *this_00;
  size_t size;
  BaseType BVar2;
  string_view message;
  ActionMessage log;
  ActionMessage AStack_e8;
  
  size = messageToLog._M_len;
  if (federateID.fid == -0x103) {
    BVar2 = (this->super_BrokerBase).global_id._M_i.gid;
  }
  else {
    pFVar1 = getFederateAt(this,federateID);
    if (pFVar1 == (FederateState *)0x0) {
      this_00 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
      message._M_str = "FederateID is not valid (logMessage)";
      message._M_len = 0x24;
      InvalidIdentifier::InvalidIdentifier(this_00,message);
      __cxa_throw(this_00,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
    }
    BVar2 = (pFVar1->global_id)._M_i.gid;
  }
  ActionMessage::ActionMessage(&AStack_e8,cmd_log);
  AStack_e8.messageID = logLevel;
  AStack_e8.source_id.gid = BVar2;
  AStack_e8.dest_id.gid = BVar2;
  AStack_e8.payload.bufferSize = size;
  if ((AStack_e8.payload.heap != (byte *)messageToLog._M_str) &&
     (SmallBuffer::reserve(&AStack_e8.payload,size), size != 0)) {
    memcpy(AStack_e8.payload.heap,messageToLog._M_str,size);
  }
  gmlc::containers::BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>
  ::push<helics::ActionMessage&>
            ((BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
             &(this->super_BrokerBase).actionQueue,&AStack_e8);
  ActionMessage::~ActionMessage(&AStack_e8);
  return;
}

Assistant:

void CommonCore::logMessage(LocalFederateId federateID, int logLevel, std::string_view messageToLog)
{
    GlobalFederateId gid;
    if (federateID == gLocalCoreId) {
        gid = global_id.load();
    } else {
        auto* fed = getFederateAt(federateID);
        if (fed == nullptr) {
            throw(InvalidIdentifier("FederateID is not valid (logMessage)"));
        }
        gid = fed->global_id;
    }
    ActionMessage log(CMD_LOG);
    log.source_id = gid;
    log.dest_id = gid;
    log.messageID = logLevel;
    log.payload = messageToLog;
    actionQueue.push(log);
}